

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  arena_t *paVar6;
  size_t sVar7;
  rtree_t *in_RCX;
  rtree_t *in_RDX;
  ulong in_RSI;
  tsd_t *in_RDI;
  rtree_ctx_t *in_R8;
  byte in_R9B;
  size_t *in_stack_00000008;
  size_t usize_max;
  size_t usize_min;
  extent_t *extent;
  _Bool ret;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  szind_t ret_7;
  szind_t ret_8;
  uint8_t state;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  ticker_t *decay_ticker;
  tsd_t *tsd;
  uintptr_t bits;
  void *result;
  size_t ret_1;
  size_t ret_3;
  szind_t ret_2;
  size_t ret_4;
  size_t ret_6;
  szind_t ret_5;
  size_t usize;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  size_t usize_1;
  size_t delta_mask_1;
  size_t delta_1;
  size_t lg_delta_1;
  size_t x_1;
  size_t lg_ceil_1;
  size_t lg_tmin_1;
  arena_t *in_stack_fffffffffffff9e8;
  tsd_t *tsd_00;
  uint in_stack_fffffffffffffa00;
  uint in_stack_fffffffffffffa04;
  long local_5f8;
  rtree_t *local_5f0;
  size_t in_stack_fffffffffffffa18;
  tsdn_t *local_5e0;
  int in_stack_fffffffffffffa2c;
  undefined1 zero_00;
  rtree_leaf_elm_t *in_stack_fffffffffffffa30;
  ulong in_stack_fffffffffffffa38;
  rtree_t *prVar8;
  tsdn_t *ptVar9;
  undefined8 in_stack_fffffffffffffa50;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5e;
  uint local_56c;
  uint local_55c;
  rtree_ctx_t local_540;
  ulong local_3c0;
  tsd_t *local_3b8;
  rtree_ctx_t *local_3b0;
  rtree_ctx_t *local_3a0;
  rtree_leaf_elm_t *local_380;
  byte local_371;
  ulong local_370;
  rtree_ctx_t *local_368;
  rtree_t *local_360;
  tsd_t *local_358;
  ulong local_350;
  ulong local_348;
  rtree_t *local_340;
  tsdn_t *local_330;
  uint local_324;
  rtree_t *local_320;
  uint local_314;
  uint8_t local_301;
  rtree_leaf_elm_t *local_2e8;
  byte local_2d9;
  ulong local_2d8;
  rtree_ctx_t *local_2d0;
  rtree_t *local_2c8;
  tsd_t *local_2c0;
  rtree_leaf_elm_t *local_2b8;
  ulong local_2b0;
  rtree_leaf_elm_t *local_2a8;
  uint local_29c;
  ulong local_298;
  rtree_leaf_elm_t *local_290;
  ulong local_288;
  rtree_leaf_elm_t *local_280;
  uintptr_t local_278;
  ulong local_270;
  undefined1 local_262;
  undefined1 local_261;
  ulong local_260;
  rtree_ctx_t *local_258;
  rtree_t *local_250;
  tsd_t *local_248;
  rtree_leaf_elm_t *local_240;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  ulong local_228;
  undefined8 local_220;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  ulong local_208;
  undefined8 local_200;
  uint local_1f4;
  undefined4 local_1f0;
  uint local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  ulong local_1e0;
  undefined8 local_1d8;
  uint local_1cc;
  undefined4 local_1c8;
  uint local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  ulong local_1b8;
  undefined8 local_1b0;
  uint local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  undefined4 local_198;
  undefined4 local_194;
  ulong local_190;
  ticker_t *local_188;
  undefined4 local_174;
  arena_t *local_170;
  void *local_150;
  byte local_141;
  rtree_leaf_elm_t *local_140;
  rtree_t *local_138;
  tsd_t *local_130;
  byte local_121;
  rtree_leaf_elm_t *local_120;
  rtree_t *local_118;
  tsd_t *local_110;
  void *local_108;
  uint local_fc;
  rtree_leaf_elm_t *local_f8;
  uint local_f0;
  int local_ec;
  void *local_e8;
  tsdn_t *local_e0;
  tsdn_t *local_d0;
  uint local_c8;
  uint local_c4;
  rtree_t *local_b8;
  ulong local_b0;
  rtree_t *local_a8;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  tsdn_t *local_90;
  ulong local_88;
  long local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  rtree_t *local_58;
  tsdn_t *local_50;
  rtree_t *local_48;
  ulong local_40;
  long local_38;
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  rtree_t *local_8;
  
  uVar10 = (undefined2)((ulong)in_stack_fffffffffffffa50 >> 0x30);
  bVar1 = in_R9B & 1;
  local_3b0 = &local_540;
  local_3c0 = in_RSI;
  local_3b8 = in_RDI;
  if (in_RDI == (tsd_t *)0x0) {
    rtree_ctx_data_init(local_3b0);
    local_3a0 = local_3b0;
    local_55c = in_stack_fffffffffffffa00;
  }
  else {
    local_301 = (((tsd_t *)&in_RDI->state)->state).repr;
    local_3a0 = &in_RDI->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    local_55c = in_stack_fffffffffffffa00;
  }
  local_358 = local_3b8;
  local_360 = &extents_rtree;
  local_368 = local_3a0;
  local_370 = local_3c0;
  local_371 = 1;
  local_2c0 = local_3b8;
  local_2c8 = &extents_rtree;
  local_2d0 = local_3a0;
  local_2d8 = local_3c0;
  local_2d9 = 1;
  local_248 = local_3b8;
  local_250 = &extents_rtree;
  local_258 = local_3a0;
  local_260 = local_3c0;
  local_261 = 1;
  local_262 = 0;
  local_228 = local_3c0;
  local_22c = 0x40;
  local_230 = 0x22;
  local_234 = 0x1e;
  uVar4 = local_3c0 >> 0x1e & 0xf;
  local_208 = local_3c0;
  local_20c = 0x40;
  local_210 = 0x22;
  local_214 = 0x1e;
  local_220 = 0xffffffffc0000000;
  uVar5 = local_3c0 & 0xffffffffc0000000;
  local_278 = uVar5;
  local_270 = uVar4;
  if (local_3a0->cache[uVar4].leafkey == uVar5) {
    local_280 = local_3a0->cache[uVar4].leaf;
    local_1e0 = local_3c0;
    local_1e4 = 1;
    local_1e8 = 0x40;
    local_1ec = 0x34;
    local_1f0 = 0xc;
    local_1f4 = 0x12;
    local_200 = 0x3ffff;
    local_288 = local_3c0 >> 0xc & 0x3ffff;
    local_240 = local_280 + local_288;
  }
  else if (local_3a0->l2_cache[0].leafkey == uVar5) {
    local_290 = local_3a0->l2_cache[0].leaf;
    local_3a0->l2_cache[0].leafkey = local_3a0->cache[uVar4].leafkey;
    local_258->l2_cache[0].leaf = local_258->cache[local_270].leaf;
    local_258->cache[local_270].leafkey = local_278;
    local_258->cache[local_270].leaf = local_290;
    local_1b8 = local_260;
    local_1bc = 1;
    local_1c0 = 0x40;
    local_1c4 = 0x34;
    local_1c8 = 0xc;
    local_1cc = 0x12;
    local_1d8 = 0x3ffff;
    local_298 = local_260 >> 0xc & 0x3ffff;
    local_240 = local_290 + local_298;
  }
  else {
    for (local_29c = 1; local_29c < 8; local_29c = local_29c + 1) {
      if (local_3a0->l2_cache[local_29c].leafkey == uVar5) {
        local_2a8 = local_3a0->l2_cache[local_29c].leaf;
        if (local_29c == 0) {
          local_3a0->l2_cache[0].leafkey = local_3a0->cache[uVar4].leafkey;
          local_258->l2_cache[0].leaf = local_258->cache[local_270].leaf;
        }
        else {
          local_3a0->l2_cache[local_29c].leafkey = local_3a0->l2_cache[local_29c - 1].leafkey;
          local_3a0->l2_cache[local_29c].leaf = local_3a0->l2_cache[local_29c - 1].leaf;
          local_3a0->l2_cache[local_29c - 1].leafkey = local_3a0->cache[uVar4].leafkey;
          local_3a0->l2_cache[local_29c - 1].leaf = local_3a0->cache[uVar4].leaf;
        }
        local_258->cache[local_270].leafkey = local_278;
        local_258->cache[local_270].leaf = local_2a8;
        local_190 = local_260;
        local_194 = 1;
        local_198 = 0x40;
        local_19c = 0x34;
        local_1a0 = 0xc;
        local_1a4 = 0x12;
        local_1b0 = 0x3ffff;
        local_2b0 = local_260 >> 0xc & 0x3ffff;
        local_240 = local_2a8 + local_2b0;
        goto LAB_00117efc;
      }
    }
    local_240 = rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)in_RDX,in_RCX,in_R8,
                           CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffa5e,
                                                   in_stack_fffffffffffffa58)),
                           SUB21((ushort)uVar10 >> 8,0),SUB21(uVar10,0));
  }
LAB_00117efc:
  local_2e8 = local_240;
  if (((local_2d9 & 1) == 0) && (local_240 == (rtree_leaf_elm_t *)0x0)) {
    local_2b8 = (rtree_leaf_elm_t *)0x0;
  }
  else {
    local_2b8 = local_240;
  }
  local_380 = local_2b8;
  if (((local_371 & 1) == 0) && (local_2b8 == (rtree_leaf_elm_t *)0x0)) {
    local_350 = 0;
  }
  else {
    local_130 = local_358;
    local_138 = local_360;
    local_140 = local_2b8;
    local_141 = local_371 & 1;
    local_110 = local_358;
    local_118 = local_360;
    local_120 = local_2b8;
    local_fc = (byte)~local_141 & 1;
    local_f8 = local_2b8;
    in_stack_fffffffffffffa38 = (ulong)local_fc;
    switch(local_fc) {
    case 0:
      local_ec = 0;
      break;
    case 1:
      local_ec = 2;
    }
    if (local_ec - 1U < 2) {
      local_108 = (local_2b8->le_bits).repr;
    }
    else if (local_ec == 5) {
      local_108 = (local_2b8->le_bits).repr;
    }
    else {
      local_108 = (local_2b8->le_bits).repr;
    }
    local_150 = local_108;
    local_e8 = local_108;
    local_350 = ((long)local_108 << 0x10) >> 0x10 & 0xfffffffffffffffe;
    in_stack_fffffffffffffa2c = local_ec;
    in_stack_fffffffffffffa30 = local_2b8;
    local_121 = local_141;
    local_f0 = local_fc;
  }
  zero_00 = (undefined1)((uint)in_stack_fffffffffffffa2c >> 0x18);
  if ((rtree_t *)0x7000000000000000 < in_RCX) {
    bVar1 = true;
    goto LAB_00118983;
  }
  if (in_RCX < (rtree_t *)0x1001) {
    local_c8 = (uint)sz_size2index_tab[(ulong)((long)&(in_RCX->init_lock).field_0 + 7U) >> 3];
    local_330 = (tsdn_t *)sz_index2size_tab[local_c8];
    local_e0 = local_330;
    local_d0 = local_330;
    local_c4 = local_c8;
  }
  else {
    local_58 = in_RCX;
    if (in_RCX < (rtree_t *)0x7000000000000001) {
      if (in_RCX == (rtree_t *)0x0) {
        local_58 = (rtree_t *)0x1;
      }
      if (local_58 < (rtree_t *)0x9) {
        local_60 = 3;
        sVar7 = pow2_ceil_zu(0x1182a0);
        uVar3 = lg_floor(sVar7);
        local_68 = (ulong)uVar3;
        if (local_68 < local_60) {
          bVar1 = (byte)local_60;
        }
        else {
          bVar1 = (byte)uVar3;
        }
        local_5e0 = (tsdn_t *)(1L << (bVar1 & 0x3f));
        local_50 = local_5e0;
      }
      else {
        uVar3 = lg_floor((long)local_58 * 2 - 1);
        local_70 = (ulong)uVar3;
        if (local_70 < 7) {
          in_stack_fffffffffffffa18 = 4;
        }
        else {
          in_stack_fffffffffffffa18 = local_70 - 3;
        }
        local_80 = 1L << ((byte)in_stack_fffffffffffffa18 & 0x3f);
        local_88 = local_80 - 1;
        local_90 = (tsdn_t *)
                   ((long)local_58->root + local_80 + -0x71 & (local_88 ^ 0xffffffffffffffff));
        local_78 = in_stack_fffffffffffffa18;
        local_50 = local_90;
      }
    }
    else {
      local_50 = (tsdn_t *)0x0;
    }
    local_330 = local_50;
  }
  local_348 = (long)&((rtree_t *)(in_RCX->root + -0xe))->root[0].child.repr +
              (long)(in_R8->cache + -7);
  ptVar9 = local_330;
  if (local_348 < 0x1001) {
    local_a0 = (uint)sz_size2index_tab[local_348 + 7 >> 3];
    local_340 = (rtree_t *)sz_index2size_tab[local_a0];
    local_b8 = local_340;
    local_b0 = local_348;
    local_a8 = local_340;
    local_9c = local_a0;
    local_98 = local_348;
  }
  else {
    local_10 = local_348;
    if (local_348 < 0x7000000000000001) {
      if (local_348 == 0) {
        local_10 = 1;
      }
      if (local_10 < 9) {
        local_18 = 3;
        sVar7 = pow2_ceil_zu(0x11851a);
        uVar3 = lg_floor(sVar7);
        local_20 = (ulong)uVar3;
        if (local_20 < local_18) {
          bVar1 = (byte)local_18;
        }
        else {
          bVar1 = (byte)uVar3;
        }
        local_5f0 = (rtree_t *)(1L << (bVar1 & 0x3f));
        local_8 = local_5f0;
      }
      else {
        uVar3 = lg_floor(local_10 * 2 - 1);
        local_28 = (ulong)uVar3;
        if (local_28 < 7) {
          local_5f8 = 4;
        }
        else {
          local_5f8 = local_28 - 3;
        }
        local_30 = local_5f8;
        local_38 = 1L << ((byte)local_5f8 & 0x3f);
        local_40 = local_38 - 1;
        local_48 = (rtree_t *)(local_10 + local_40 & (local_40 ^ 0xffffffffffffffff));
        local_8 = local_48;
      }
    }
    else {
      local_8 = (rtree_t *)0x0;
    }
    local_340 = local_8;
  }
  uVar3 = in_stack_fffffffffffffa04 & 0xffffff;
  if (in_RDX < (rtree_t *)0x3801) {
    uVar3 = CONCAT13(ptVar9 < (tsdn_t *)0x3801,(int3)in_stack_fffffffffffffa04);
  }
  if ((char)(uVar3 >> 0x18) == '\0') {
    if ((in_RDX < (rtree_t *)0x4000) || (local_340 < (rtree_t *)0x4000)) {
      bVar1 = true;
    }
    else {
      bVar1 = large_ralloc_no_move
                        (ptVar9,(extent_t *)local_340,in_stack_fffffffffffffa38,
                         (size_t)in_stack_fffffffffffffa30,(_Bool)zero_00);
    }
    goto LAB_00118983;
  }
  prVar8 = local_340;
  if (local_340 < (rtree_t *)0x3801) {
    if (local_340 < (rtree_t *)0x1001) {
      local_320 = local_340;
      local_55c = (uint)sz_size2index_tab[(ulong)((long)&(local_340->init_lock).field_0 + 7U) >> 3];
      local_324 = local_55c;
    }
    else {
      local_55c = sz_size2index_compute(in_stack_fffffffffffffa18);
    }
    if (in_RDX < (rtree_t *)0x1001) {
      local_56c = (uint)sz_size2index_tab[(ulong)((long)&(in_RDX->init_lock).field_0 + 7U) >> 3];
      local_314 = local_56c;
    }
    else {
      local_56c = sz_size2index_compute(in_stack_fffffffffffffa18);
    }
    if (local_55c != local_56c) goto LAB_001187b6;
  }
  else {
LAB_001187b6:
    if ((in_RDX < in_RCX) || (prVar8 < in_RDX)) {
      bVar1 = true;
      goto LAB_00118983;
    }
  }
  paVar6 = extent_arena_get((extent_t *)CONCAT44(uVar3,local_55c));
  tsd_00 = in_RDI;
  malloc_mutex_assert_not_owner((tsdn_t *)in_stack_fffffffffffff9e8,(malloc_mutex_t *)0x118829);
  malloc_mutex_assert_not_owner((tsdn_t *)in_stack_fffffffffffff9e8,(malloc_mutex_t *)0x118845);
  local_174 = 1;
  local_170 = paVar6;
  if (in_RDI != (tsd_t *)0x0) {
    arena_ind_get((arena_t *)0x1188d1);
    local_188 = decay_ticker_get(tsd_00,(uint)((ulong)in_RDI >> 0x20));
    if ((local_188 != (ticker_t *)0x0) &&
       (_Var2 = ticker_ticks((ticker_t *)in_stack_fffffffffffff9e8,0), _Var2)) {
      arena_decay((tsdn_t *)in_RDI,in_stack_fffffffffffff9e8,false,false);
    }
  }
  bVar1 = false;
LAB_00118983:
  sVar7 = extent_usize_get((extent_t *)in_stack_fffffffffffff9e8);
  *in_stack_00000008 = sVar7;
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	extent_t *extent = iealloc(tsdn, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_decay_tick(tsdn, extent_arena_get(extent));
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, extent, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(extent == iealloc(tsdn, ptr));
	*newsize = extent_usize_get(extent);

	return ret;
}